

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaHelper.h
# Opt level: O1

void __thiscall Assimp::Collada::Node::~Node(Node *this)

{
  Node *this_00;
  pointer pcVar1;
  pointer ppNVar2;
  
  ppNVar2 = (this->mChildren).
            super__Vector_base<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppNVar2 !=
      (this->mChildren).
      super__Vector_base<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      this_00 = *ppNVar2;
      if (this_00 != (Node *)0x0) {
        ~Node(this_00);
        operator_delete(this_00);
      }
      ppNVar2 = ppNVar2 + 1;
    } while (ppNVar2 !=
             (this->mChildren).
             super__Vector_base<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  pcVar1 = (this->mPrimaryCamera)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->mPrimaryCamera).field_2) {
    operator_delete(pcVar1);
  }
  std::vector<Assimp::Collada::NodeInstance,_std::allocator<Assimp::Collada::NodeInstance>_>::
  ~vector(&this->mNodeInstances);
  std::vector<Assimp::Collada::CameraInstance,_std::allocator<Assimp::Collada::CameraInstance>_>::
  ~vector(&this->mCameras);
  std::vector<Assimp::Collada::LightInstance,_std::allocator<Assimp::Collada::LightInstance>_>::
  ~vector(&this->mLights);
  std::vector<Assimp::Collada::MeshInstance,_std::allocator<Assimp::Collada::MeshInstance>_>::
  ~vector(&this->mMeshes);
  std::vector<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>::~vector
            (&this->mTransforms);
  ppNVar2 = (this->mChildren).
            super__Vector_base<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppNVar2 != (pointer)0x0) {
    operator_delete(ppNVar2);
  }
  pcVar1 = (this->mSID)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->mSID).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->mID)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->mID).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->mName)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->mName).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

~Node() {
        for( std::vector<Node*>::iterator it = mChildren.begin(); it != mChildren.end(); ++it)
            delete *it;
    }